

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ParseResult *
read_quoted(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,string *form)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ASTNode> quote;
  ParseResult object;
  value_type local_88;
  __shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  ParseResult local_60;
  
  std::make_shared<ASTNode>();
  (local_88.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = NAME;
  std::__cxx11::string::_M_assign
            ((string *)
             &(local_88.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value);
  peVar1 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar1->type = LIST;
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  push_back(&peVar1->list,&local_88);
  read_object(&local_60,is);
  if (local_60.result == OK) {
    std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
    push_back(&((node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->list,
              &local_60.node);
    std::__shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,&node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>);
    _Var2._M_pi = local_78._M_refcount._M_pi;
    peVar1 = local_78._M_ptr;
    __return_storage_ptr__->result = OK;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    (__return_storage_ptr__->error)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error).field_2;
    (__return_storage_ptr__->error)._M_string_length = 0;
    (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  }
  else {
    ParseResult::ParseResult(__return_storage_ptr__,&local_60);
  }
  ParseResult::~ParseResult(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static ParseResult read_quoted(std::istream &is, const std::shared_ptr<ASTNode> &node, const std::string &form)
{
    auto quote = std::make_shared<ASTNode>();
    quote->type = ast_type_t::NAME;
    quote->value = form;
    node->type = ast_type_t::LIST;
    node->list.push_back(quote);
    auto object = read_object(is);
    if(object.result == parse_result_t::OK)
    {
        node->list.push_back(object.node);
        return node;
    }
    return object;
}